

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O2

void __thiscall BoardView::HandleInput(BoardView *this)

{
  shared_ptr<Pin> *this_00;
  SharedVector<Component> *this_01;
  KeyBindings *this_02;
  bool *pbVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  __shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  __shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  __shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> *p_Var7;
  long *plVar8;
  ImVec2 IVar9;
  undefined1 auVar10 [16];
  bool bVar11;
  bool bVar12;
  undefined4 extraout_EAX;
  ImGuiIO *pIVar13;
  Board *pBVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  shared_ptr<Component> *part_1;
  BRDFileBase *pBVar15;
  long *plVar16;
  byte bVar17;
  long lVar18;
  uint8_t uVar19;
  __shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> *p_Var20;
  element_type *peVar21;
  long lVar22;
  shared_ptr<Component> *part;
  __shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> *p_Var23;
  shared_ptr<Pin> *pin;
  __shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2> *__r;
  int iVar24;
  int iVar25;
  float fVar26;
  float fVar27;
  shared_ptr<Component> p;
  shared_ptr<Pin> selection;
  float local_88;
  float local_78;
  float fStack_74;
  float local_68;
  float fStack_64;
  long local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  long local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  if (this->m_board == (Board *)0x0) {
    return;
  }
  if (this->m_file == (BRDFileBase *)0x0) {
    return;
  }
  pIVar13 = ImGui::GetIO();
  bVar11 = ImGui::IsWindowHovered(0);
  if (bVar11) {
    bVar11 = ImGui::IsWindowFocused(0);
    if (!bVar11) {
      ImGui::FocusWindow((ImGuiWindow *)0x0,2);
    }
    bVar11 = ImGui::IsMouseDragging(0,-1.0);
    iVar24 = this->m_dragging_token;
    if (bVar11) {
      if (iVar24 != 1) {
        if ((iVar24 != 0) ||
           (fVar27 = (this->m_board_surface).x,
           fVar27 < pIVar13->MouseClickedPos[0].x || fVar27 == pIVar13->MouseClickedPos[0].x))
        goto LAB_0011534d;
        this->m_dragging_token = 1;
      }
      IVar9 = ImGui::GetMouseDragDelta(0,-1.0);
      iVar24 = -(uint)(500.0 < ABS(IVar9.x));
      iVar25 = -(uint)(500.0 < ABS(IVar9.y));
      auVar10._4_4_ = iVar24;
      auVar10._0_4_ = iVar24;
      auVar10._8_4_ = iVar25;
      auVar10._12_4_ = iVar25;
      iVar24 = movmskpd(extraout_EAX,auVar10);
      fVar27 = 0.0;
      fVar26 = 0.0;
      if (iVar24 == 0) {
        fVar27 = IVar9.x;
        fVar26 = IVar9.y;
      }
      ImGui::ResetMouseDragDelta(0);
      IVar9 = ScreenToCoord(this,fVar27,fVar26,0.0);
      uVar3 = this->m_dx;
      uVar4 = this->m_dy;
      this->m_dx = (float)uVar3 + IVar9.x;
      this->m_dy = (float)uVar4 + IVar9.y;
      this->m_needsRedraw = true;
      this->m_draggingLastFrame = true;
    }
    else if (-1 < iVar24) {
      this->m_dragging_token = 0;
      if (this->m_lastFileOpenWasInvalid == false) {
        pBVar15 = this->m_file;
        pBVar14 = this->m_board;
        if (pBVar14 == (Board *)0x0 || pBVar15 == (BRDFileBase *)0x0) {
          bVar17 = 0;
LAB_00114e85:
          if (pBVar14 != (Board *)0x0 && (pBVar15 != (BRDFileBase *)0x0 && (bVar17 & 1) == 0)) {
            bVar11 = ImGui::IsMouseReleased(2);
            if (bVar11) {
              FlipBoard(this,0);
              goto LAB_00115311;
            }
            bVar17 = this->m_lastFileOpenWasInvalid;
            pBVar15 = this->m_file;
            pBVar14 = this->m_board;
          }
          if (((((bVar17 & 1) == 0) && (pBVar15 != (BRDFileBase *)0x0)) && (pBVar14 != (Board *)0x0)
              ) && ((bVar11 = ImGui::IsMouseReleased(0), bVar11 &&
                    (this->m_draggingLastFrame == false)))) {
            IVar9 = ImGui::GetMousePos();
            IVar9 = ScreenToCoord(this,IVar9.x,IVar9.y,1.0);
            this->m_needsRedraw = true;
            iVar24 = this->m_pinDiameter;
            selection.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            selection.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            iVar25 = (*this->m_board->_vptr_Board[4])();
            local_88 = (float)iVar24 * 0.5;
            local_88 = local_88 * local_88;
            __r = *(__shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2> **)CONCAT44(extraout_var,iVar25);
            p_Var5 = (__shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2> *)
                     ((undefined8 *)CONCAT44(extraout_var,iVar25))[1];
            fStack_64 = IVar9.y;
            for (; local_68 = IVar9.x, __r != p_Var5; __r = __r + 1) {
              std::__shared_ptr<BoardElement,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Pin,void>
                        ((__shared_ptr<BoardElement,(__gnu_cxx::_Lock_policy)2> *)&local_40,__r);
              if (local_40 == 0) {
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
LAB_00114fe6:
                peVar21 = __r->_M_ptr;
                local_68 = (peVar21->position).x - local_68;
                fVar27 = (peVar21->position).y - fStack_64;
                fVar27 = local_68 * local_68 + fVar27 * fVar27;
                if ((fVar27 < peVar21->diameter * peVar21->diameter) && (fVar27 < local_88)) {
                  std::__shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>::operator=
                            (&selection.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>,__r);
                  local_88 = fVar27;
                }
              }
              else {
                iVar24 = *(int *)(local_40 + 8);
                iVar25 = this->m_current_side;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
                if ((iVar24 == 2) || (iVar24 == iVar25)) goto LAB_00114fe6;
              }
            }
            this_00 = &this->m_pinSelected;
            std::__shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>::operator=
                      (&this_00->super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>,
                       &selection.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>);
            peVar21 = (this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            if (peVar21 == (element_type *)0x0) {
LAB_00115101:
              iVar24 = (*this->m_board->_vptr_Board[3])();
              p_Var6 = (__shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> *)
                       ((undefined8 *)CONCAT44(extraout_var_01,iVar24))[1];
              this_01 = &this->m_partHighlighted;
              bVar11 = false;
              for (p_Var23 = *(__shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> **)
                              CONCAT44(extraout_var_01,iVar24); p_Var23 != p_Var6;
                  p_Var23 = p_Var23 + 1) {
                std::__shared_ptr<BoardElement,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<Component,void>
                          ((__shared_ptr<BoardElement,(__gnu_cxx::_Lock_policy)2> *)&local_50,
                           p_Var23);
                if (local_50 == 0) {
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
LAB_00115183:
                  p.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                       (element_type *)(p_Var23->_M_ptr->outline)._M_elems[0];
                  p.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       (p_Var23->_M_ptr->outline)._M_elems[1];
                  bVar12 = false;
                  lVar18 = 3;
                  for (lVar22 = 0; lVar22 != 4; lVar22 = lVar22 + 1) {
                    fVar27 = *(float *)((long)&p.
                                               super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr + lVar22 * 8 + 4);
                    fVar26 = *(float *)((long)&p.
                                               super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr + lVar18 * 8 + 4);
                    if ((fStack_64 < fVar27 == fVar26 <= fStack_64) &&
                       (fVar2 = *(float *)(&p.
                                            super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr + lVar22),
                       local_68 <
                       ((fStack_64 - fVar27) *
                       (*(float *)(&p.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr + lVar18) - fVar2)) / (fVar26 - fVar27) + fVar2)) {
                      bVar12 = (bool)(bVar12 ^ 1);
                    }
                    lVar18 = lVar22;
                  }
                  if (bVar12) {
                    bVar12 = contains<std::shared_ptr<Component>>
                                       ((shared_ptr<Component> *)p_Var23,this_01);
                    if (pIVar13->KeyCtrl == true) {
                      if (bVar12) {
                        remove<std::shared_ptr<Component>>((shared_ptr<Component> *)p_Var23,this_01)
                        ;
                        uVar19 = '\0';
                      }
                      else {
LAB_001152a0:
                        uVar19 = '\x01';
                        std::
                        vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                        ::push_back(this_01,(value_type *)p_Var23);
                      }
                      p_Var23->_M_ptr->visualmode = uVar19;
                      bVar11 = true;
                    }
                    else {
                      iVar24 = (*this->m_board->_vptr_Board[3])();
                      p_Var7 = (__shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> *)
                               ((undefined8 *)CONCAT44(extraout_var_02,iVar24))[1];
                      for (p_Var20 = *(__shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> **)
                                      CONCAT44(extraout_var_02,iVar24); p_Var20 != p_Var7;
                          p_Var20 = p_Var20 + 1) {
                        std::__shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                                  (&p.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>,
                                   p_Var20);
                        (p.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        visualmode = '\0';
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                  (&p.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount);
                      }
                      std::
                      vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                      ::resize(this_01,0);
                      std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::
                      resize(&this->m_pinHighlighted,0);
                      bVar11 = true;
                      if (!bVar12) goto LAB_001152a0;
                    }
                  }
                }
                else {
                  iVar24 = *(int *)(local_50 + 8);
                  iVar25 = this->m_current_side;
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
                  if ((iVar24 == 2) || (iVar24 == iVar25)) goto LAB_00115183;
                }
              }
              if ((!bVar11) && (pIVar13->KeyCtrl == false)) {
                iVar24 = (*this->m_board->_vptr_Board[3])();
                plVar8 = (long *)((undefined8 *)CONCAT44(extraout_var_03,iVar24))[1];
                for (plVar16 = *(long **)CONCAT44(extraout_var_03,iVar24); plVar16 != plVar8;
                    plVar16 = plVar16 + 2) {
                  *(undefined1 *)(*plVar16 + 0xe0) = 0;
                }
                std::
                vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::
                clear(this_01);
              }
            }
            else {
              if (pIVar13->KeyCtrl == false) {
                iVar24 = (*this->m_board->_vptr_Board[3])();
                p_Var6 = (__shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> *)
                         ((undefined8 *)CONCAT44(extraout_var_00,iVar24))[1];
                for (p_Var23 = *(__shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> **)
                                CONCAT44(extraout_var_00,iVar24); p_Var23 != p_Var6;
                    p_Var23 = p_Var23 + 1) {
                  std::__shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                            (&p.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>,p_Var23);
                  (p.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->visualmode =
                       '\0';
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&p.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
                }
                std::
                vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::
                resize(&this->m_partHighlighted,0);
                std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::resize
                          (&this->m_pinHighlighted,0);
                peVar21 = (this_00->super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              }
              ((peVar21->component).super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              )->visualmode = '\x01';
              std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
              ::push_back(&this->m_partHighlighted,&peVar21->component);
              if ((this_00->super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
                  (element_type *)0x0) goto LAB_00115101;
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&selection.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          }
          else if (this->m_showContextMenu == false) {
            iVar24 = AnnotationIsHovered(this);
            if (iVar24 == 0) {
              this->AnnotationWasHovered = false;
              this->m_needsRedraw = true;
            }
            else {
              this->m_needsRedraw = true;
              this->AnnotationWasHovered = true;
            }
          }
        }
        else {
          bVar11 = ImGui::IsMouseClicked(1,false);
          if (!bVar11) {
            bVar17 = this->m_lastFileOpenWasInvalid;
            pBVar15 = this->m_file;
            pBVar14 = this->m_board;
            goto LAB_00114e85;
          }
          if ((this->config).showAnnotations == true) {
            IVar9 = ImGui::GetMousePos();
            iVar24 = AnnotationIsHovered(this);
            if (iVar24 != 0) {
              this->m_annotation_clicked_id = this->m_annotation_last_hovered;
            }
            this->m_annotationedit_retain = false;
            this->m_showContextMenu = true;
            local_78 = IVar9.x;
            fStack_74 = IVar9.y;
            (this->m_showContextMenuPos).x = local_78;
            (this->m_showContextMenuPos).y = fStack_74;
            this->m_needsRedraw = true;
            if (this->debug == true) {
              fprintf(_stderr,"context click request at (%f %f)\n",SUB84((double)local_78,0),
                      SUB84((double)fStack_74,0));
            }
          }
        }
LAB_00115311:
        this->m_draggingLastFrame = false;
      }
      fVar27 = pIVar13->MouseWheel;
      if ((fVar27 != 0.0) || (NAN(fVar27))) {
        Zoom(this,(pIVar13->MousePos).x,(pIVar13->MousePos).y,fVar27 * (this->config).zoomFactor);
      }
    }
  }
LAB_0011534d:
  if (pIVar13->WantCaptureKeyboard != false) {
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&p,"Mirror",(allocator<char> *)&selection);
  this_02 = &this->keybindings;
  bVar11 = KeyBindings::isPressed(this_02,(string *)&p);
  std::__cxx11::string::~string((string *)&p);
  if (bVar11) {
    Mirror(this);
    CenterView(this);
LAB_001153a0:
    this->m_needsRedraw = true;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&p,"RotateCW",(allocator<char> *)&selection);
    bVar11 = KeyBindings::isPressed(this_02,(string *)&p);
    std::__cxx11::string::~string((string *)&p);
    if (bVar11) {
      iVar24 = 1;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&p,"RotateCCW",(allocator<char> *)&selection);
      bVar11 = KeyBindings::isPressed(this_02,(string *)&p);
      std::__cxx11::string::~string((string *)&p);
      if (!bVar11) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&p,"ZoomIn",(allocator<char> *)&selection);
        bVar11 = KeyBindings::isPressed(this_02,(string *)&p);
        std::__cxx11::string::~string((string *)&p);
        if (bVar11) {
          fVar2 = (this->m_board_surface).x;
          fVar26 = (this->m_board_surface).y;
          fVar27 = (this->config).zoomFactor;
LAB_001154d3:
          Zoom(this,fVar2 * 0.5,fVar26 * 0.5,fVar27);
          return;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&p,"ZoomOut",(allocator<char> *)&selection);
        bVar11 = KeyBindings::isPressed(this_02,(string *)&p);
        std::__cxx11::string::~string((string *)&p);
        if (bVar11) {
          fVar2 = (this->m_board_surface).x;
          fVar26 = (this->m_board_surface).y;
          fVar27 = -(this->config).zoomFactor;
          goto LAB_001154d3;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&p,"PanDown",(allocator<char> *)&selection);
        bVar11 = KeyBindings::isPressed(this_02,(string *)&p);
        std::__cxx11::string::~string((string *)&p);
        if (bVar11) {
          iVar25 = DPI((this->config).panFactor);
          iVar24 = 2;
LAB_001155d5:
          Pan(this,iVar24,iVar25);
          return;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&p,"PanUp",(allocator<char> *)&selection);
        bVar11 = KeyBindings::isPressed(this_02,(string *)&p);
        std::__cxx11::string::~string((string *)&p);
        if (bVar11) {
          iVar25 = DPI((this->config).panFactor);
          iVar24 = 1;
          goto LAB_001155d5;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&p,"PanLeft",(allocator<char> *)&selection);
        bVar11 = KeyBindings::isPressed(this_02,(string *)&p);
        std::__cxx11::string::~string((string *)&p);
        if (bVar11) {
          iVar25 = DPI((this->config).panFactor);
          iVar24 = 3;
          goto LAB_001155d5;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&p,"PanRight",(allocator<char> *)&selection);
        bVar11 = KeyBindings::isPressed(this_02,(string *)&p);
        std::__cxx11::string::~string((string *)&p);
        if (bVar11) {
          iVar25 = DPI((this->config).panFactor);
          iVar24 = 4;
          goto LAB_001155d5;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&p,"Center",(allocator<char> *)&selection);
        bVar11 = KeyBindings::isPressed(this_02,(string *)&p);
        std::__cxx11::string::~string((string *)&p);
        if (bVar11) {
          CenterView(this);
          return;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&p,"Quit",(allocator<char> *)&selection);
        bVar11 = KeyBindings::isPressed(this_02,(string *)&p);
        std::__cxx11::string::~string((string *)&p);
        if (bVar11) {
          this->m_wantsQuit = true;
          return;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&p,"InfoPanel",(allocator<char> *)&selection);
        bVar11 = KeyBindings::isPressed(this_02,(string *)&p);
        std::__cxx11::string::~string((string *)&p);
        if (bVar11) {
          bVar11 = (bool)((this->config).showInfoPanel ^ 1);
          (this->config).showInfoPanel = bVar11;
          Confparse::WriteBool(&this->obvconfig,"showInfoPanel",bVar11);
          return;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&p,"NetList",(allocator<char> *)&selection);
        bVar11 = KeyBindings::isPressed(this_02,(string *)&p);
        std::__cxx11::string::~string((string *)&p);
        if (bVar11) {
          this->m_showNetList = (bool)(this->m_showNetList ^ 1);
          return;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&p,"PartList",(allocator<char> *)&selection);
        bVar11 = KeyBindings::isPressed(this_02,(string *)&p);
        std::__cxx11::string::~string((string *)&p);
        if (bVar11) {
          this->m_showPartList = (bool)(this->m_showPartList ^ 1);
          return;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&p,"Flip",(allocator<char> *)&selection);
        bVar11 = KeyBindings::isPressed(this_02,(string *)&p);
        std::__cxx11::string::~string((string *)&p);
        if (bVar11) {
          FlipBoard(this,0);
          return;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&p,"TogglePins",(allocator<char> *)&selection);
        bVar11 = KeyBindings::isPressed(this_02,(string *)&p);
        std::__cxx11::string::~string((string *)&p);
        if (!bVar11) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&p,"Search",(allocator<char> *)&selection);
          bVar11 = KeyBindings::isPressed(this_02,(string *)&p);
          std::__cxx11::string::~string((string *)&p);
          if (!bVar11) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&p,"Clear",(allocator<char> *)&selection);
            bVar11 = KeyBindings::isPressed(this_02,(string *)&p);
            std::__cxx11::string::~string((string *)&p);
            if (!bVar11) {
              return;
            }
            ClearAllHighlights(this);
            return;
          }
          if (this->m_validBoard != true) {
            return;
          }
          this->m_showSearch = true;
          this->m_needsRedraw = true;
          return;
        }
        pbVar1 = &(this->config).showPins;
        *pbVar1 = (bool)(*pbVar1 ^ 1);
        goto LAB_001153a0;
      }
      iVar24 = -1;
    }
    Rotate(this,iVar24);
  }
  return;
}

Assistant:

void BoardView::HandleInput() {
	if (!m_board || (!m_file)) return;

	const ImGuiIO &io = ImGui::GetIO();

	if (ImGui::IsWindowHovered()) {
		if (!ImGui::IsWindowFocused()) {
			// Set focus on boardview area hover to apply our key bindings instead of the currently active ImGui's keyboard navigation
			// Using imgui_internal's FocusWindow with UnlessBelowModal instead of SetWindowFocus
			// Otherwise PopupModal get closed right after opening when boardview area is hovered
			// https://github.com/ocornut/imgui/issues/3595
			// Warning: wouldn't work with regular Popup but we use only PopupModal
			ImGui::FocusWindow(nullptr, ImGuiFocusRequestFlags_UnlessBelowModal);
		}

		if (ImGui::IsMouseDragging(0)) {
			if ((m_dragging_token == 0) && (io.MouseClickedPos[0].x < m_board_surface.x)) m_dragging_token = 1; // own it.
			if (m_dragging_token == 1) {
				//		   if ((io.MouseClickedPos[0].x < m_info_surface.x)) {
				ImVec2 delta = ImGui::GetMouseDragDelta();
				if ((abs(delta.x) > 500) || (abs(delta.y) > 500)) {
					delta.x = 0;
					delta.y = 0;
				} // If the delta values are crazy just drop them (happens when panning
				// off screen). 500 arbritary chosen
				ImGui::ResetMouseDragDelta();
				ImVec2 td = ScreenToCoord(delta.x, delta.y, 0);
				m_dx += td.x;
				m_dy += td.y;
				m_draggingLastFrame = true;
				m_needsRedraw       = true;
			}
		} else if (m_dragging_token >= 0) {
			m_dragging_token = 0;

			if (m_lastFileOpenWasInvalid == false) {
				// Conext menu
				if (!m_lastFileOpenWasInvalid && m_file && m_board && ImGui::IsMouseClicked(1)) {
					if (config.showAnnotations) {
						// Build context menu here, for annotations and inspection
						//
						ImVec2 spos = ImGui::GetMousePos();
						if (AnnotationIsHovered()) m_annotation_clicked_id = m_annotation_last_hovered;

						m_annotationedit_retain = false;
						m_showContextMenu       = true;
						m_showContextMenuPos    = spos;
						m_needsRedraw           = true;
						if (debug) fprintf(stderr, "context click request at (%f %f)\n", spos.x, spos.y);
					}

					// Flip the board with the middle click
				} else if (!m_lastFileOpenWasInvalid && m_file && m_board && ImGui::IsMouseReleased(2)) {
					FlipBoard();

					// Else, click to select pin
				} else if (!m_lastFileOpenWasInvalid && m_file && m_board && ImGui::IsMouseReleased(0) && !m_draggingLastFrame) {
					ImVec2 spos = ImGui::GetMousePos();
					ImVec2 pos  = ScreenToCoord(spos.x, spos.y);

					m_needsRedraw = true;

					// threshold to within a pin's diameter of the pin center
					// float min_dist = m_pinDiameter * 1.0f;
					float min_dist = m_pinDiameter / 2.0f;
					min_dist *= min_dist; // all distance squared
					std::shared_ptr<Pin> selection = nullptr;
					for (auto &pin : m_board->Pins()) {
						if (BoardElementIsVisible(pin)) {
							float dx   = pin->position.x - pos.x;
							float dy   = pin->position.y - pos.y;
							float dist = dx * dx + dy * dy;
							if ((dist < (pin->diameter * pin->diameter)) && (dist < min_dist)) {
								selection = pin;
								min_dist  = dist;
							}
						}
					}

					m_pinSelected = selection;
					if (m_pinSelected) {
						if (!io.KeyCtrl) {
							for (auto p : m_board->Components()) {
								p->visualmode = p->CVMNormal;
							}
							m_partHighlighted.resize(0);
							m_pinHighlighted.resize(0);
						}
						m_pinSelected->component->visualmode = m_pinSelected->component->CVMSelected;
						m_partHighlighted.push_back(m_pinSelected->component);
					}

					if (m_pinSelected == nullptr) {
						bool any_hits = false;

						for (auto &part : m_board->Components()) {
							int hit = 0;
							//							auto p_part = part.get();

							if (!BoardElementIsVisible(part)) continue;

							// Work out if the point is inside the hull
							{
								auto poly = part->outline;

								for (size_t i = 0, j = poly.size() - 1; i < poly.size(); j = i++) {
									if (((poly[i].y > pos.y) != (poly[j].y > pos.y)) &&
									    (pos.x <
									     (poly[j].x - poly[i].x) * (pos.y - poly[i].y) / (poly[j].y - poly[i].y) + poly[i].x))
										hit ^= 1;
								}
							}

							if (hit) {
								any_hits = true;

								bool partInList = contains(part, m_partHighlighted);

								/*
								 * If the CTRL key isn't held down, then we have to
								 * flush any existing highlighted parts
								 */
								if (io.KeyCtrl) {
									if (!partInList) {
										m_partHighlighted.push_back(part);
										part->visualmode = part->CVMSelected;
									} else {
										remove(part, m_partHighlighted);
										part->visualmode = part->CVMNormal;
									}

								} else {
									for (auto p : m_board->Components()) {
										p->visualmode = p->CVMNormal;
									}
									m_partHighlighted.resize(0);
									m_pinHighlighted.resize(0);
									if (!partInList) {
										m_partHighlighted.push_back(part);
										part->visualmode = part->CVMSelected;
									}
								}

								/*
								 * If this part has a non-selected visual mode (normal)
								 * AND it's not in the existing part list, then add it
								 */
								/*
								if (part->visualmode == part->CVMNormal) {
								    if (!partInList) {
								        m_partHighlighted.push_back(p_part);
								    }
								}

								part->visualmode++;
								part->visualmode %= part->CVMModeCount;

								if (part->visualmode == part->CVMNormal) {
								    remove(*part, m_partHighlighted);
								}
								*/
							} // if hit
						}     // for each part on the board

						/*
						 * If we aren't holding down CTRL and we click to a
						 * non pin, non part area, then we clear everything
						 */
						if ((!any_hits) && (!io.KeyCtrl)) {
							for (auto &part : m_board->Components()) {
								//								auto p        = part.get();
								part->visualmode = part->CVMNormal;
							}
							m_partHighlighted.clear();
						}

					} // if a pin wasn't selected

				} else {
					if (!m_showContextMenu) {
						if (AnnotationIsHovered()) {
							m_needsRedraw        = true;
							AnnotationWasHovered = true;
						} else {
							AnnotationWasHovered = false;
							m_needsRedraw        = true;
						}
					}
				}

				m_draggingLastFrame = false;
			}

			// Zoom:
			float mwheel = io.MouseWheel;
			if (mwheel != 0.0f) {
				mwheel *= config.zoomFactor;

				Zoom(io.MousePos.x, io.MousePos.y, mwheel);
			}
		}
	}

	if ((!io.WantCaptureKeyboard)) {

		if (keybindings.isPressed("Mirror")) {
			Mirror();
			CenterView();
			m_needsRedraw = true;

		} else if (keybindings.isPressed("RotateCW")) {
			// Rotate board: R and period rotate clockwise; comma rotates
			// counter-clockwise
			Rotate(1);

		} else if (keybindings.isPressed("RotateCCW")) {
			Rotate(-1);

		} else if (keybindings.isPressed("ZoomIn")) {
			Zoom(m_board_surface.x / 2, m_board_surface.y / 2, config.zoomFactor);

		} else if (keybindings.isPressed("ZoomOut")) {
			Zoom(m_board_surface.x / 2, m_board_surface.y / 2, -config.zoomFactor);

		} else if (keybindings.isPressed("PanDown")) {
			Pan(DIR_DOWN, DPI(config.panFactor));

		} else if (keybindings.isPressed("PanUp")) {
			Pan(DIR_UP, DPI(config.panFactor));

		} else if (keybindings.isPressed("PanLeft")) {
			Pan(DIR_LEFT, DPI(config.panFactor));

		} else if (keybindings.isPressed("PanRight")) {
			Pan(DIR_RIGHT, DPI(config.panFactor));

		} else if (keybindings.isPressed("Center")) {
			// Center and reset zoom
			CenterView();

		} else if (keybindings.isPressed("Quit")) {
			// quit OFBV
			m_wantsQuit = true;

		} else if (keybindings.isPressed("InfoPanel")) {
			config.showInfoPanel = !config.showInfoPanel;
			obvconfig.WriteBool("showInfoPanel", config.showInfoPanel ? true : false);

		} else if (keybindings.isPressed("NetList")) {
			// Show Net List
			m_showNetList = m_showNetList ? false : true;

		} else if (keybindings.isPressed("PartList")) {
			// Show Part List
			m_showPartList = m_showPartList ? false : true;

		} else if (keybindings.isPressed("Flip")) {
			// Flip board:
			FlipBoard();

		} else if (keybindings.isPressed("TogglePins")) {
			config.showPins ^= 1;
			m_needsRedraw = true;

		} else if (keybindings.isPressed("Search")) {
			if (m_validBoard) {
				m_showSearch  = true;
				m_needsRedraw = true;
			}

		} else if (keybindings.isPressed("Clear")) {
			ClearAllHighlights();

		} else {
			/*
			 * Do what ever is required for unhandled key presses.
			 */
		}
	}
}